

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O1

void point_edwards2legacy(pt_prj_t_conflict4 *Q,pt_prj_t_conflict4 *P)

{
  uint64_t *out1;
  uint64_t *arg1;
  uint64_t local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  arg1 = P->Z;
  out1 = Q->T;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add(out1,arg1,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(&local_88,arg1,P->Y);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(&local_88,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out1,const_S,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Q->Y,arg1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Q->Z,P->X,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(&local_88,&local_88,const_T);
  local_88 = Q->T[0] + local_88;
  lStack_80 = Q->T[1] + lStack_80;
  local_78 = Q->T[2] + local_78;
  lStack_70 = Q->T[3] + lStack_70;
  local_68 = Q->T[4] + local_68;
  lStack_60 = Q->T[5] + lStack_60;
  local_58 = Q->T[6] + local_58;
  lStack_50 = Q->T[7] + lStack_50;
  local_48 = Q->T[8] + local_48;
  lStack_40 = Q->T[9] + lStack_40;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(&local_88,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Q->X,P->X,&local_88);
  return;
}

Assistant:

static void point_edwards2legacy(pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0;
    /* constants */
    const limb_t *T = const_T;
    const limb_t *S = const_S;
    const limb_t *X1 = P->X;
    const limb_t *Y1 = P->Y;
    const limb_t *Z1 = P->Z;
    limb_t *X3 = Q->X;
    limb_t *Y3 = Q->Y;
    limb_t *T3 = Q->T;
    limb_t *Z3 = Q->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(T3, Z1, Y1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(t0, Z1, Y1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(T3, S, T3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Y3, Z1, T3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Z3, X1, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(t0, t0, T);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(t0, T3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(X3, X1, t0);
}